

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGRSubgraphMining.cpp
# Opt level: O0

void dgrminer::map_isolated_nodes
               (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *results,
               multiset<dgrminer::node_label_changetime,_std::less<dgrminer::node_label_changetime>,_std::allocator<dgrminer::node_label_changetime>_>
               *isolated_nodes_counts,iterator *occurrences_iterator,
               iterator *end_occurrences_iterator,vector<int,_std::allocator<int>_> *tmp)

{
  pointer pvVar1;
  bool bVar2;
  pointer ppVar3;
  pointer __x;
  size_type combination_size;
  size_type sVar4;
  size_type sVar5;
  iterator local_a8;
  int *local_a0;
  int *local_88;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_80;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_78;
  const_iterator local_70;
  reference local_68;
  vector<int,_std::allocator<int>_> *combination;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *__range1;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  all_combinations;
  vector<int,_std::allocator<int>_> *tmp_local;
  iterator *end_occurrences_iterator_local;
  iterator *occurrences_iterator_local;
  multiset<dgrminer::node_label_changetime,_std::less<dgrminer::node_label_changetime>,_std::allocator<dgrminer::node_label_changetime>_>
  *isolated_nodes_counts_local;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *results_local;
  
  all_combinations.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = tmp;
  bVar2 = std::operator==(occurrences_iterator,end_occurrences_iterator);
  if (bVar2) {
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::push_back(results,all_combinations.
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  else {
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_dgrminer::node_label_changetime,_std::vector<int,_std::allocator<int>_>_>_>
             ::operator->(occurrences_iterator);
    __x = std::
          _Rb_tree_iterator<std::pair<const_dgrminer::node_label_changetime,_std::vector<int,_std::allocator<int>_>_>_>
          ::operator->(occurrences_iterator);
    combination_size =
         std::
         multiset<dgrminer::node_label_changetime,_std::less<dgrminer::node_label_changetime>,_std::allocator<dgrminer::node_label_changetime>_>
         ::count(isolated_nodes_counts,&__x->first);
    combinations((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  *)&__range1,&ppVar3->second,combination_size);
    __end1 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::begin((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      *)&__range1);
    combination = (vector<int,_std::allocator<int>_> *)
                  std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::end((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         *)&__range1);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                  *)&combination);
      if (!bVar2) break;
      local_68 = __gnu_cxx::
                 __normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                 ::operator*(&__end1);
      pvVar1 = all_combinations.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_78._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::end
                            (all_combinations.
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
      __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
      __normal_iterator<int*>
                ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_70,
                 &local_78);
      local_80._M_current = (int *)std::vector<int,_std::allocator<int>_>::cbegin(local_68);
      local_88 = (int *)std::vector<int,_std::allocator<int>_>::cend(local_68);
      local_a0 = (int *)std::vector<int,std::allocator<int>>::
                        insert<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,void>
                                  ((vector<int,std::allocator<int>> *)pvVar1,local_70,local_80,
                                   (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                    )local_88);
      local_a8._M_node =
           (_Base_ptr)
           std::
           next<std::_Rb_tree_iterator<std::pair<dgrminer::node_label_changetime_const,std::vector<int,std::allocator<int>>>>>
                     (occurrences_iterator->_M_node,1);
      map_isolated_nodes(results,isolated_nodes_counts,&local_a8,end_occurrences_iterator,
                         all_combinations.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pvVar1 = all_combinations.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      sVar4 = std::vector<int,_std::allocator<int>_>::size
                        (all_combinations.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      sVar5 = std::vector<int,_std::allocator<int>_>::size(local_68);
      std::vector<int,_std::allocator<int>_>::resize(pvVar1,sVar4 - sVar5);
      __gnu_cxx::
      __normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
      ::operator++(&__end1);
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)&__range1);
  }
  return;
}

Assistant:

void map_isolated_nodes(
		std::vector<std::vector<int>> &results,
		const std::multiset<node_label_changetime>& isolated_nodes_counts,
		const std::map<node_label_changetime, std::vector<int>>::iterator& occurrences_iterator,
		const std::map<node_label_changetime, std::vector<int>>::iterator& end_occurrences_iterator,
		std::vector<int>& tmp
	) {
	  	//check whether end of mapped node labels was reached and backtrack
	  	if (occurrences_iterator == end_occurrences_iterator) {
			results.push_back(tmp);
			return;
		}

	  	// list all possible combinations of real ids
	  	const std::vector<std::vector<int>> all_combinations = combinations(
	  		occurrences_iterator->second,
			isolated_nodes_counts.count(occurrences_iterator->first)
		);

	  	// move to next item mapped node labels
	  	for (auto const &combination : all_combinations) {
			tmp.insert(tmp.end(), combination.cbegin(), combination.cend());

		  	map_isolated_nodes(
				results,
				isolated_nodes_counts,
				std::next(occurrences_iterator),
				end_occurrences_iterator,
				tmp
			);

			tmp.resize(tmp.size() - combination.size());
		}
	}